

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

Tim_Man_t * Tim_ManDup(Tim_Man_t *p,int fUnitDelay)

{
  long lVar1;
  Tim_Man_t *p_00;
  Vec_Ptr_t *pVVar2;
  float *pfVar3;
  float *Entry;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  
  uVar5 = p->nCis;
  lVar1 = 0;
  uVar6 = 0;
  if (0 < (int)uVar5) {
    uVar6 = (ulong)uVar5;
  }
  while ((uVar6 * 0x18 - lVar1 != 0 && (p->pCis != (Tim_Obj_t *)0x0))) {
    *(undefined4 *)((long)&p->pCis->TravId + lVar1) = 0;
    lVar1 = lVar1 + 0x18;
  }
  uVar8 = p->nCos;
  lVar1 = 0;
  uVar6 = 0;
  if (0 < (int)uVar8) {
    uVar6 = (ulong)uVar8;
  }
  while ((uVar6 * 0x18 - lVar1 != 0 && (p->pCos != (Tim_Obj_t *)0x0))) {
    *(undefined4 *)((long)&p->pCos->TravId + lVar1) = 0;
    lVar1 = lVar1 + 0x18;
  }
  p_00 = Tim_ManStart(uVar5,uVar8);
  memcpy(p_00->pCis,p->pCis,(long)p->nCis * 0x18);
  memcpy(p_00->pCos,p->pCos,(long)p->nCos * 0x18);
  if (fUnitDelay != 0) {
    Tim_ManInitPiArrivalAll(p,0.0);
    Tim_ManInitPoRequiredAll(p,1e+09);
  }
  if ((p->vDelayTables != (Vec_Ptr_t *)0x0) && (iVar7 = p->vDelayTables->nSize, 0 < iVar7)) {
    pVVar2 = Vec_PtrStart(iVar7);
    p_00->vDelayTables = pVVar2;
    for (iVar7 = 0; iVar7 < p->vDelayTables->nSize; iVar7 = iVar7 + 1) {
      pfVar3 = (float *)Vec_PtrEntry(p->vDelayTables,iVar7);
      if (pfVar3 != (float *)0x0) {
        if (iVar7 != (int)*pfVar3) {
          __assert_fail("i == (int)pDelayTable[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                        ,0x7b,"Tim_Man_t *Tim_ManDup(Tim_Man_t *, int)");
        }
        uVar5 = (int)pfVar3[2] * (int)pfVar3[1];
        Entry = (float *)malloc((long)(int)uVar5 * 4 + 0xc);
        *Entry = (float)iVar7;
        Entry[1] = (float)(int)pfVar3[1];
        Entry[2] = (float)(int)pfVar3[2];
        if ((int)uVar5 < 1) {
          uVar5 = 0;
        }
        for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
          fVar9 = pfVar3[uVar6 + 3];
          if (fUnitDelay != 0) {
            fVar9 = (float)fUnitDelay;
          }
          uVar8 = -(uint)(pfVar3[uVar6 + 3] == -1e+09);
          Entry[uVar6 + 3] = (float)(uVar8 & 0xce6e6b28 | ~uVar8 & (uint)fVar9);
        }
        pvVar4 = Vec_PtrEntry(pVVar2,iVar7);
        if (pvVar4 != (void *)0x0) {
          __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                        ,0x88,"Tim_Man_t *Tim_ManDup(Tim_Man_t *, int)");
        }
        Vec_PtrWriteEntry(pVVar2,iVar7,Entry);
      }
    }
  }
  if ((p->vBoxes != (Vec_Ptr_t *)0x0) && (iVar7 = p->vBoxes->nSize, 0 < iVar7)) {
    pVVar2 = Vec_PtrAlloc(iVar7);
    p_00->vBoxes = pVVar2;
    for (iVar7 = 0; iVar7 < p->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(p->vBoxes,iVar7);
      Tim_ManCreateBox(p_00,*(int *)((long)pvVar4 + 0x1c),*(int *)((long)pvVar4 + 8),
                       *(int *)((long)pvVar4 + (long)*(int *)((long)pvVar4 + 8) * 4 + 0x1c),
                       *(int *)((long)pvVar4 + 0xc),*(int *)((long)pvVar4 + 0x10),
                       *(int *)((long)pvVar4 + 0x18));
      Tim_ManBoxSetCopy(p_00,iVar7,*(int *)((long)pvVar4 + 0x14));
    }
  }
  return p_00;
}

Assistant:

Tim_Man_t * Tim_ManDup( Tim_Man_t * p, int fUnitDelay )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, nInputs, nOutputs;
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( p->nCis, p->nCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * p->nCis ); 
    memcpy( pNew->pCos, p->pCos, sizeof(Tim_Obj_t) * p->nCos ); 
    if ( fUnitDelay )
    {
        // discretize PI arrival times
//        Tim_ManForEachPi( pNew, pObj, k )
//          pObj->timeArr = (int)pObj->timeArr;
        // discretize PO required times
//        Tim_ManForEachPo( pNew, pObj, k )
//          pObj->timeReq = 1 + (int)pObj->timeReq;
        // clear PI arrival and PO required
        Tim_ManInitPiArrivalAll( p, 0.0 );
        Tim_ManInitPoRequiredAll( p, (float)TIM_ETERNITY );
    }
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = (int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
				if ( pDelayTable[3+k] == -ABC_INFINITY )
					pDelayTableNew[3+k] = -ABC_INFINITY;
				else
					pDelayTableNew[3+k] = fUnitDelay ? (float)fUnitDelay : pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
//printf( "Finished duplicating delay table %d.\n", i );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Tim_ManForEachBox( p, pBox, i )
        {
           Tim_ManCreateBox( pNew, pBox->Inouts[0], pBox->nInputs, 
                pBox->Inouts[pBox->nInputs], pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
           Tim_ManBoxSetCopy( pNew, i, pBox->iCopy );
        }
    }
    return pNew;
}